

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O0

btVector3 operator*(btVector3 *v,btScalar *s)

{
  float *in_RSI;
  float *in_RDI;
  float local_2c;
  float local_28;
  float local_24 [5];
  btVector3 local_10;
  
  local_24[0] = *in_RDI * *in_RSI;
  local_28 = in_RDI[1] * *in_RSI;
  local_2c = in_RDI[2] * *in_RSI;
  btVector3::btVector3(&local_10,local_24,&local_28,&local_2c);
  return (btVector3)local_10.m_floats;
}

Assistant:

SIMD_FORCE_INLINE btVector3
operator*(const btVector3& v, const btScalar& s)
{
#if defined(BT_USE_SSE_IN_API) && defined (BT_USE_SSE)
	__m128	vs = _mm_load_ss(&s);	//	(S 0 0 0)
	vs = bt_pshufd_ps(vs, 0x80);	//	(S S S 0.0)
	return btVector3(_mm_mul_ps(v.mVec128, vs));
#elif defined(BT_USE_NEON)
	float32x4_t r = vmulq_n_f32(v.mVec128, s);
	return btVector3((float32x4_t)vandq_s32((int32x4_t)r, btvFFF0Mask));
#else
	return btVector3(v.m_floats[0] * s, v.m_floats[1] * s, v.m_floats[2] * s);
#endif
}